

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

BOOL CreateDirectoryA(LPCSTR lpPathName,LPSECURITY_ATTRIBUTES lpSecurityAttributes)

{
  long lVar1;
  int iVar2;
  char *lpPath;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sizeInBytes;
  DWORD dwErrCode;
  BOOL BVar10;
  char *string;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  char acStack_48 [12];
  DWORD local_3c;
  long lStack_38;
  DWORD dwLastError;
  
  pcVar4 = acStack_48;
  pcVar8 = acStack_48;
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  pcVar9 = acStack_48;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0032755e;
  if (lpSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    lpPath = (char *)0x0;
    uStack_50 = 0x327378;
    fprintf(_stderr,"] %s %s:%d","CreateDirectoryA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
            ,0x21e);
    uStack_50 = 0x327389;
    fprintf(_stderr,"lpSecurityAttributes is not NULL as it should be\n");
    local_3c = 0x57;
    pcVar4 = acStack_48;
    dwErrCode = 0x57;
    goto LAB_003274a3;
  }
  if (lpPathName == (LPCSTR)0x0) {
    local_3c = 3;
    dwErrCode = 3;
LAB_003274a1:
    lpPath = (char *)0x0;
LAB_003274a3:
    pcVar4[-8] = -0x58;
    pcVar4[-7] = 't';
    pcVar4[-6] = '2';
    pcVar4[-5] = '\0';
    pcVar4[-4] = '\0';
    pcVar4[-3] = '\0';
    pcVar4[-2] = '\0';
    pcVar4[-1] = '\0';
    SetLastError(dwErrCode);
    pcVar8 = pcVar4;
LAB_003274a8:
    BVar10 = 0;
  }
  else {
    uStack_50 = 0x3273a8;
    lpPath = PAL__strdup(lpPathName);
    if (lpPath == (char *)0x0) {
      pcVar9 = acStack_48;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032755e;
      local_3c = 8;
      dwErrCode = 8;
      goto LAB_003274a1;
    }
    uStack_50 = 0x3273bc;
    FILEDosToUnixPathA(lpPath);
    uStack_50 = 0x3273c4;
    sVar3 = strlen(lpPath);
    if (1 < (int)sVar3) {
      uVar7 = sVar3 & 0xffffffff;
      do {
        if (lpPath[uVar7 - 1] != '/') break;
        lpPath[uVar7 - 1] = '\0';
        iVar2 = (int)uVar7;
        uVar7 = (ulong)(iVar2 - 1);
      } while (2 < iVar2);
    }
    pcVar4 = acStack_48;
    string = lpPath;
    if (*lpPath != '/') {
      uStack_50 = 0x3273fa;
      pcVar4 = PAL__getcwd((char *)0x0,0x400);
      if (pcVar4 != (char *)0x0) {
        uStack_50 = 0x32740e;
        sVar5 = strlen(pcVar4);
        sizeInBytes = (size_t)((int)sVar5 + (int)sVar3 + 2);
        lVar1 = -(sizeInBytes + 0xf & 0xfffffffffffffff0);
        string = acStack_48 + lVar1;
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x32743f;
        sprintf_s(string,sizeInBytes,"%s/%s",pcVar4,lpPath);
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x327447;
        PAL_free(pcVar4);
        pcVar4 = string;
        goto LAB_00327447;
      }
      pcVar9 = acStack_48;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032755e;
      uStack_50 = 0x327532;
      piVar6 = __errno_location();
      uStack_50 = 0x327539;
      strerror(*piVar6);
      uStack_50 = 0x32753e;
      local_3c = DIRGetLastErrorFromErrno();
LAB_00327543:
      pcVar4 = pcVar8;
      dwErrCode = local_3c;
      if (local_3c != 0) goto LAB_003274a3;
      goto LAB_003274a8;
    }
LAB_00327447:
    pcVar8 = pcVar4;
    builtin_strncpy(pcVar8 + -8,"Ot2",4);
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    FILECanonicalizePath(string);
    builtin_strncpy(pcVar8 + -8,"Wt2",4);
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    sVar3 = strlen(string);
    pcVar4 = pcVar8;
    pcVar9 = pcVar8;
    if (0x3ff < sVar3) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032755e;
      local_3c = 0xce;
      dwErrCode = 0xce;
      goto LAB_003274a3;
    }
    pcVar8[-8] = -0x10;
    pcVar8[-7] = 't';
    pcVar8[-6] = '2';
    pcVar8[-5] = '\0';
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    iVar2 = mkdir(string,0x1ff);
    if (iVar2 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032755e;
      builtin_strncpy(pcVar8 + -8,"\x01u2",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      if (iVar2 == 0x14) {
LAB_00327512:
        builtin_strncpy(pcVar8 + -8,"!u2",4);
        pcVar8[-4] = '\0';
        pcVar8[-3] = '\0';
        pcVar8[-2] = '\0';
        pcVar8[-1] = '\0';
        FILEGetProperNotFoundError(string,&local_3c);
        goto LAB_00327543;
      }
      if (iVar2 == 0x11) {
        local_3c = 0xb7;
        dwErrCode = 0xb7;
      }
      else {
        if (iVar2 == 2) goto LAB_00327512;
        local_3c = 5;
        dwErrCode = 5;
      }
      goto LAB_003274a3;
    }
    BVar10 = 1;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032755e;
  }
  *(undefined8 *)(pcVar8 + -8) = 0x3274b3;
  PAL_free(lpPath);
  pcVar9 = pcVar8;
  if (PAL_InitializeChakraCoreCalled != false) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
      *(code **)(pcVar8 + -8) = RemoveDirectoryA;
      __stack_chk_fail();
    }
    return BVar10;
  }
LAB_0032755e:
  builtin_strncpy(pcVar9 + -8,"cu2",4);
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  abort();
}

Assistant:

BOOL
PALAPI
CreateDirectoryA(
         IN LPCSTR lpPathName,
         IN LPSECURITY_ATTRIBUTES lpSecurityAttributes)
{
    BOOL  bRet = FALSE;
    DWORD dwLastError = 0;
    char *realPath;
    LPSTR UnixPathName = NULL;
    int pathLength;
    int i;
    const int mode = S_IRWXU | S_IRWXG | S_IRWXO;

    PERF_ENTRY(CreateDirectoryA);
    ENTRY("CreateDirectoryA(lpPathName=%p (%s), lpSecurityAttr=%p)\n",
          lpPathName?lpPathName:"NULL",
          lpPathName?lpPathName:"NULL", lpSecurityAttributes);

    if ( lpSecurityAttributes )
    {
        ASSERT("lpSecurityAttributes is not NULL as it should be\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    // Windows returns ERROR_PATH_NOT_FOUND when called with NULL.
    // If we don't have this check, strdup(NULL) segfaults.
    if (lpPathName == NULL)
    {
        ERROR("CreateDirectoryA called with NULL pathname!\n");
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    UnixPathName = PAL__strdup(lpPathName);
    if (UnixPathName == NULL )
    {
        ERROR("PAL__strdup() failed\n");
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    FILEDosToUnixPathA( UnixPathName );
    // Remove any trailing slashes at the end because mkdir might not
    // handle them appropriately on all platforms.
    pathLength = strlen(UnixPathName);
    i = pathLength;
    while(i > 1)
    {
        if(UnixPathName[i - 1] =='/')
        {
            UnixPathName[i - 1]='\0';
            i--;
        }
        else
        {
            break;
        }
    }

    // Check the constraint for the real path length (should be < MAX_LONGPATH).

    // Get an absolute path.
    if (UnixPathName[0] == '/')
    {
        realPath = UnixPathName;
    }
    else
    {
        const char *cwd = PAL__getcwd(NULL, MAX_LONGPATH);        
        if (NULL == cwd)
        {
            WARN("Getcwd failed with errno=%d [%s]\n", errno, strerror(errno));
            dwLastError = DIRGetLastErrorFromErrno();
            goto done;
        }

        // Copy cwd, '/', path
        int iLen = strlen(cwd) + 1 + pathLength + 1;
        realPath = static_cast<char *>(alloca(iLen));
        sprintf_s(realPath, iLen, "%s/%s", cwd, UnixPathName);

        PAL_free((char *)cwd);
    }
    
    // Canonicalize the path so we can determine its length.
    FILECanonicalizePath(realPath);

    if (strlen(realPath) >= MAX_LONGPATH)
    {
        WARN("UnixPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        dwLastError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    if ( mkdir(realPath, mode) != 0 )
    {
        TRACE("Creation of directory [%s] was unsuccessful, errno = %d.\n",
              UnixPathName, errno);

        switch( errno )
        {
        case ENOTDIR:
            /* FALL THROUGH */
        case ENOENT:
            FILEGetProperNotFoundError( realPath, &dwLastError );
            goto done;
        case EEXIST:
            dwLastError = ERROR_ALREADY_EXISTS;
            break;
        default:
            dwLastError = ERROR_ACCESS_DENIED;
        }
    }
    else
    {
        TRACE("Creation of directory [%s] was successful.\n", UnixPathName);
        bRet = TRUE;
    }

done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }
    PAL_free( UnixPathName );
    LOGEXIT("CreateDirectoryA returns BOOL %d\n", bRet);
    PERF_EXIT(CreateDirectoryA);
    return bRet;
}